

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

void __thiscall Block::move(Block *this,int direction)

{
  int iVar1;
  
  if (this->direction == 0) {
    if (direction == 1) {
      iVar1 = this->column;
      if (this->length + iVar1 == 6) {
        throwError("Block cannot move RIGHT.",this->id);
        iVar1 = this->column;
      }
      iVar1 = iVar1 + 1;
    }
    else {
      if (direction != 0) {
        return;
      }
      iVar1 = this->column;
      if (iVar1 == 0) {
        throwError("Block cannot move LEFT.",this->id);
        iVar1 = this->column;
      }
      iVar1 = iVar1 + -1;
    }
    this->column = iVar1;
  }
  else {
    if (direction == 3) {
      iVar1 = this->row;
      if (iVar1 == 5) {
        throwError("Block cannot move down.",this->id);
        iVar1 = this->row;
      }
      iVar1 = iVar1 + 1;
    }
    else {
      if (direction != 2) {
        return;
      }
      iVar1 = this->row;
      if (iVar1 - this->length == -1) {
        throwError("Block cannot move up.",this->id);
        iVar1 = this->row;
      }
      iVar1 = iVar1 + -1;
    }
    this->row = iVar1;
  }
  return;
}

Assistant:

void Block::move(int direction) {
    if (this->isHorizontal()) {
        switch (direction) {
            case LEFT:
                if (this->column == 0) {
                    throwError("Block cannot move LEFT.", this->id);
                }

                this->column--;
                break;
            case RIGHT:
                if (this->column + this->length == BOARD_SIZE) {
                    throwError("Block cannot move RIGHT.", this->id);
                }

                this->column++;
                break;
            default:
                break;
        }
    } else {
        switch (direction) {
            case UP:
                if (this->row - this->length + 1 == 0) {
                    throwError("Block cannot move up.", this->id);
                }

                this->row--;
                break;
            case DOWN:
                if (this->row == BOARD_SIZE - 1) {
                    throwError("Block cannot move down.", this->id);
                }

                this->row++;
                break;
            default:
                break;
        }
    }
}